

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_cleanup(int n,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  mpc_parser_t **list;
  int i;
  undefined8 *local_f0;
  undefined8 local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  uint local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined8 *local_18;
  void *local_10;
  int local_8;
  int local_4;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[1] = in_RSI;
  local_d8[2] = in_RDX;
  local_d8[3] = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_4 = in_EDI;
  local_10 = malloc((long)in_EDI << 3);
  local_18 = local_d8;
  local_20 = (undefined8 *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  for (local_8 = 0; local_8 < local_4; local_8 = local_8 + 1) {
    if (local_28 < 0x29) {
      local_f0 = (undefined8 *)((long)local_18 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_f0 = local_20;
      local_20 = local_20 + 1;
    }
    *(undefined8 *)((long)local_10 + (long)local_8 * 8) = *local_f0;
  }
  for (local_8 = 0; local_8 < local_4; local_8 = local_8 + 1) {
    mpc_undefine((mpc_parser_t *)0x29750c);
  }
  for (local_8 = 0; local_8 < local_4; local_8 = local_8 + 1) {
    mpc_delete((mpc_parser_t *)0x297553);
  }
  free(local_10);
  return;
}

Assistant:

void mpc_cleanup(int n, ...) {
  int i;
  mpc_parser_t **list = malloc(sizeof(mpc_parser_t*) * n);

  va_list va;
  va_start(va, n);
  for (i = 0; i < n; i++) { list[i] = va_arg(va, mpc_parser_t*); }
  for (i = 0; i < n; i++) { mpc_undefine(list[i]); }
  for (i = 0; i < n; i++) { mpc_delete(list[i]); }
  va_end(va);

  free(list);
}